

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall tinyusdz::Attribute::get_value<tinyusdz::value::quath>(Attribute *this,quath *v)

{
  half hVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::quath> ret;
  optional<tinyusdz::value::quath> local_2c;
  optional<tinyusdz::value::quath> local_22;
  
  if (v == (quath *)0x0) {
    local_2c.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::quath>(&local_2c,&this->_var);
    local_22.has_value_ = local_2c.has_value_;
    if (local_2c.has_value_ != false) {
      local_22.contained = local_2c.contained;
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::quath>::value(&local_22);
      hVar1.value = (pvVar2->real).value;
      v->imag = (half3)(pvVar2->imag)._M_elems[0];
      v->real = (half)hVar1.value;
    }
  }
  return local_2c.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }